

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O3

char * cmCTestResourceSpec::ResultToString(ReadFileResult result)

{
  if (result < (INVALID_RESOURCE_TYPE|JSON_PARSE_ERROR)) {
    return &DAT_007480a4 + *(int *)(&DAT_007480a4 + (ulong)result * 4);
  }
  return "Unknown";
}

Assistant:

const char* cmCTestResourceSpec::ResultToString(ReadFileResult result)
{
  switch (result) {
    case ReadFileResult::READ_OK:
      return "OK";

    case ReadFileResult::FILE_NOT_FOUND:
      return "File not found";

    case ReadFileResult::JSON_PARSE_ERROR:
      return "JSON parse error";

    case ReadFileResult::INVALID_ROOT:
      return "Invalid root object";

    case ReadFileResult::NO_VERSION:
      return "No version specified";

    case ReadFileResult::INVALID_VERSION:
      return "Invalid version object";

    case ReadFileResult::UNSUPPORTED_VERSION:
      return "Unsupported version";

    case ReadFileResult::INVALID_SOCKET_SPEC:
      return "Invalid socket object";

    case ReadFileResult::INVALID_RESOURCE_TYPE:
      return "Invalid resource type object";

    case ReadFileResult::INVALID_RESOURCE:
      return "Invalid resource object";

    default:
      return "Unknown";
  }
}